

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O2

int handle_keyb(void)

{
  char *__s;
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  ulong uVar4;
  char cmd_00;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint local_60;
  undefined4 local_5c;
  char cmd [25];
  
  cmd[0x10] = '\0';
  cmd[0x11] = '\0';
  cmd[0x12] = '\0';
  cmd[0x13] = '\0';
  cmd[0x14] = '\0';
  cmd[0x15] = '\0';
  cmd[0x16] = '\0';
  cmd[0x17] = '\0';
  cmd[0x18] = '\0';
  cmd[0] = '\0';
  cmd[1] = '\0';
  cmd[2] = '\0';
  cmd[3] = '\0';
  cmd[4] = '\0';
  cmd[5] = '\0';
  cmd[6] = '\0';
  cmd[7] = '\0';
  cmd[8] = '\0';
  cmd[9] = '\0';
  cmd[10] = '\0';
  cmd[0xb] = '\0';
  cmd[0xc] = '\0';
  cmd[0xd] = '\0';
  cmd[0xe] = '\0';
  cmd[0xf] = '\0';
  sVar2 = read(0,cmd,0x18);
  if (0x12 < sVar2) {
    return 1;
  }
  sVar3 = strlen(cmd);
  if (sVar3 != 0) {
    cmd[sVar3 - 1] = '\0';
  }
  __s = cmd + 1;
  sVar3 = strlen(__s);
  cmd_00 = cmd[0];
  switch(cmd[0]) {
  case 'n':
    cmd_00 = '-';
LAB_00102db3:
    uVar6 = 0;
    uVar5 = 0xffff800;
    goto LAB_00102f44;
  case 'o':
  case 'p':
  case 's':
  case 't':
  case 'u':
  case 'v':
    break;
  case 'q':
    running = 0;
    break;
  case 'r':
    iVar1 = readsettings(__s);
    if (iVar1 < 0) {
      return 0;
    }
    break;
  case 'w':
    iVar1 = writesettings(__s);
    if (iVar1 != 0) {
      return 0;
    }
    break;
  default:
    if (cmd[0] == ' ') {
      clearscreen = 0;
      return 1;
    }
    if (cmd[0] == '#') {
      clearscreen = 0;
      notch = 1;
      return 1;
    }
    if (cmd[0] == 'c') {
      if (color == '\x01') {
        color = 0;
        clearscreen = 0;
        return 1;
      }
      color = 1;
      clearscreen = 0;
      return 1;
    }
    if ((cmd[0] == '+') || (cmd[0] == '-')) {
      iVar1 = (int)sVar3;
      if (iVar1 == 3) {
LAB_00102e7c:
        __isoc99_sscanf(__s,"%x",&local_60);
        if (iVar1 == 8) {
          local_60 = local_60 | 0x80000000;
        }
        uVar5 = sniftab_index(local_60);
        if ((int)uVar5 < 0) {
          clearscreen = 0;
          return 1;
        }
        if (cmd_00 == '+') {
          uVar6 = sniftab[uVar5].flags | 1;
        }
        else {
          uVar6 = sniftab[uVar5].flags & 0xfffffffe;
        }
        sniftab[uVar5].flags = uVar6;
        clearscreen = 0;
        return 1;
      }
      if (iVar1 == 0x10) {
        __isoc99_sscanf(cmd + 9,"%x",&local_5c);
        cmd[9] = '\0';
        __isoc99_sscanf(__s,"%x",&local_60);
        uVar5 = local_5c | 0x80000000;
        uVar6 = local_60 | 0x80000000;
        local_60 = uVar6;
        local_5c = uVar5;
      }
      else {
        if (iVar1 == 8) goto LAB_00102e7c;
        if (iVar1 != 6) {
          clearscreen = 0;
          return 1;
        }
        __isoc99_sscanf(__s,"%x",&local_60);
        uVar5 = local_60 | 0xffff800;
        uVar6 = local_60 >> 0xc & 0x7ff;
        local_60 = uVar6;
      }
    }
    else {
      if (cmd[0] == '8') {
        binary8 = '\x01';
LAB_00102e28:
        if (binary != '\x01') {
          if (binary8 != '\x01') {
            binary = 1;
            binary_gap = 0;
            clearscreen = 0;
            return 1;
          }
          vdl = "|";
          binary = 1;
          binary_gap = 0;
          clearscreen = 0;
          return 1;
        }
        if (binary8 != '\x01') {
          binary = 0;
          binary_gap = 0;
          clearscreen = 0;
          return 1;
        }
        vdl = " | ";
        binary = 0;
        binary_gap = 0;
        clearscreen = 0;
        return 1;
      }
      if (cmd[0] == '@') {
        print_ascii._0_1_ = (byte)print_ascii ^ 1;
        clearscreen = 0;
        return 1;
      }
      if (cmd[0] == 'A') {
        cmd_00 = '+';
      }
      else {
        if (cmd[0] == 'B') {
          if (binary8 == '\x01') {
            vdl = " | ";
          }
          if (binary == '\x01') {
            binary = 0;
            binary_gap = 1;
            clearscreen = 0;
            return 1;
          }
          binary = 1;
          binary_gap = 1;
          clearscreen = 0;
          return 1;
        }
        if (cmd[0] != 'N') {
          if (cmd[0] != 'a') {
            if (cmd[0] != 'b') {
              if (cmd[0] != '*') {
                clearscreen = 0;
                return 1;
              }
              sVar3 = 8;
              if (max_dlen != '\0') {
                sVar3 = 0x40;
              }
              uVar7 = 0;
              uVar4 = (ulong)(uint)idx;
              if (idx < 1) {
                uVar4 = uVar7;
              }
              for (; uVar4 * 0x158 - uVar7 != 0; uVar7 = uVar7 + 0x158) {
                memset(sniftab[0].notch.data + uVar7,0,sVar3);
              }
              clearscreen = 0;
              return 1;
            }
            goto LAB_00102e28;
          }
          cmd_00 = '+';
          goto LAB_00102db3;
        }
        cmd_00 = '-';
      }
      uVar6 = 0x80000000;
      uVar5 = 0x80000000;
    }
LAB_00102f44:
    do_modify_sniftab(uVar6,uVar5,cmd_00);
  }
  clearscreen = 0;
  return 1;
}

Assistant:

int handle_keyb(void)
{
	char cmd [25] = {0};
	int i, clen;
	unsigned int mask;
	unsigned int value;

	if (read(0, cmd, 24) > (long)strlen("+1234567812345678\n"))
		return 1; /* ignore */

	if (strlen(cmd) > 0)
		cmd[strlen(cmd)-1] = 0; /* chop off trailing newline */

	clen = strlen(&cmd[1]); /* content length behind command */

	switch (cmd[0]) {

	case '+':
	case '-':
		if (clen == 6) {
			/* masking strict SFF ID content vvvmmm */
			sscanf(&cmd[1], "%x", &value);
			mask = value | 0xFFFF800; /* cleared flags! */
			value >>= 12;
			value &= 0x7FF;
			do_modify_sniftab(value, mask, cmd[0]);
			break;
		} else if (clen == 16) {
			sscanf(&cmd[9], "%x", &mask);
			cmd[9] = 0; /* terminate 'value' */
			sscanf(&cmd[1], "%x", &value);
			mask |= CAN_EFF_FLAG;
			value |= CAN_EFF_FLAG;
			do_modify_sniftab(value, mask, cmd[0]);
			break;
		}

		/* check for single SFF/EFF CAN ID length */
		if (clen != 3 && clen != 8)
			break;

		/* enable/disable single SFF/EFF CAN ID */
		sscanf(&cmd[1], "%x", &value);
		if (clen == 8)
			value |= CAN_EFF_FLAG;

		i = sniftab_index(value);
		if (i < 0)
			break; /* No Match */

		if (cmd[0] == '+')
			do_set(i, ENABLE);
		else
			do_clr(i, ENABLE);

		break;

	case 'a' : /* all SFF CAN IDs */
		value = 0;
		mask = 0xFFFF800; /* cleared flags! */
		do_modify_sniftab(value, mask, '+');
		break;

	case 'n' : /* none SFF CAN IDs */
		value = 0;
		mask = 0xFFFF800; /* cleared flags! */
		do_modify_sniftab(value, mask, '-');
		break;

	case 'A' : /* all EFF CAN IDs */
		value = CAN_EFF_FLAG;
		mask = CAN_EFF_FLAG;
		do_modify_sniftab(value, mask, '+');
		break;

	case 'N' : /* none EFF CAN IDs */
		value = CAN_EFF_FLAG;
		mask = CAN_EFF_FLAG;
		do_modify_sniftab(value, mask, '-');
		break;

	case 'w' :
		if (writesettings(&cmd[1]))
			return 0;
		break;

	case 'r' :
		if (readsettings(&cmd[1]) < 0)
			return 0;
		break;

	case 'q' :
		running = 0;
		break;

	case '@' :
		/* toggle ASCII output */
		print_ascii ^= 1;
		break;

	case 'B' :
		binary_gap = 1;
		switchvdl(LDL);
		if (binary)
			binary = 0;
		else
			binary = 1;

		break;

	case '8' :
		binary8 = 1;
		/* fallthrough */

	case 'b' :
		binary_gap = 0;
		if (binary) {
			binary = 0;
			switchvdl(LDL);
		} else {
			binary = 1;
			switchvdl(SDL);
		}
		break;

	case 'c' :
		if (color)
			color = 0;
		else
			color = 1;

		break;

	case ' ' :
		clearscreen = 1;
		break;

	case '#' :
		notch = 1;
		break;

	case '*' :
		for (i = 0; i < idx; i++)
			memset(&sniftab[i].notch.data, 0, max_dlen);
		break;

	default:
		break;
	}

	clearscreen = 1;

	return 1; /* ok */
}